

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

bool __thiscall
apngasm::APNGAsm::save(APNGAsm *this,string *outputPath,uchar coltype,uint first,uint loops)

{
  ulong uVar1;
  uint uVar2;
  uchar coltype_00;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  uchar *pimage1;
  uchar *ptemp;
  uchar *ptemp_00;
  uchar *ptemp_01;
  uchar *rows;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  long lVar10;
  pointer pAVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint idat_size;
  undefined7 in_register_00000011;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uchar uVar20;
  uint uVar21;
  uint uVar22;
  ulong __n;
  bool bVar24;
  int iVar25;
  int local_184;
  uint zsize;
  uchar *local_170;
  ulong local_168;
  int local_15c;
  FILE *local_158;
  undefined8 local_150;
  ulong local_148;
  ulong local_140;
  uchar *local_138;
  long local_130;
  ulong local_128;
  uchar *local_120;
  uchar buf_fcTL [26];
  uchar buf_acTL [8];
  uchar png_sign [8];
  uchar buf_IHDR [13];
  uchar png_Software [27];
  ulong uVar23;
  
  png_sign[0] = 0x89;
  png_sign[1] = 'P';
  png_sign[2] = 'N';
  png_sign[3] = 'G';
  png_sign[4] = '\r';
  png_sign[5] = '\n';
  png_sign[6] = '\x1a';
  png_sign[7] = '\n';
  builtin_memcpy(png_Software + 0x10,"sembler 3.0",0xb);
  builtin_memcpy(png_Software,"Software",9);
  builtin_memcpy(png_Software + 9,"APNG As",7);
  local_15c = (int)CONCAT71(in_register_00000011,coltype);
  uVar14 = 2;
  if (local_15c != 4) {
    uVar14 = (ulong)((uint)(local_15c == 6) * 3 + 1);
  }
  local_168 = 3;
  if (local_15c != 2) {
    local_168 = uVar14;
  }
  local_148 = CONCAT44(local_148._4_4_,loops);
  if (local_15c == 0) {
    if (this->_trnssize == 0) {
LAB_0013a498:
      local_140 = 1;
LAB_0013a4a2:
      uVar14 = 0;
      local_150 = 0;
      goto LAB_0013a4ab;
    }
    uVar14 = (ulong)this->_trns[1];
  }
  else if (coltype == '\x02') {
    if (this->_trnssize == 0) goto LAB_0013a498;
    uVar14 = (ulong)((uint)this->_trns[1] | (uint)this->_trns[3] << 8 | (uint)this->_trns[5] << 0x10
                    );
  }
  else {
    local_150 = 1;
    uVar14 = 0;
    if (coltype == '\x03') {
      uVar14 = 0;
      if (this->_trnssize == 0) {
        local_140 = 1;
      }
      else {
        do {
          bVar24 = this->_trns[uVar14] == '\0';
          local_140 = (ulong)!bVar24;
          if (bVar24) goto LAB_0013a4ab;
          uVar14 = uVar14 + 1;
        } while (this->_trnssize != (uint)uVar14);
      }
      goto LAB_0013a4a2;
    }
  }
  local_150 = 1;
  local_140 = 0;
LAB_0013a4ab:
  uVar16 = this->_width * (int)local_168;
  uVar22 = this->_height;
  __n = (ulong)(uVar16 * uVar22);
  pimage1 = (uchar *)operator_new__(__n);
  ptemp = (uchar *)operator_new__(__n);
  ptemp_00 = (uchar *)operator_new__(__n);
  ptemp_01 = (uchar *)operator_new__(__n);
  local_120 = (uchar *)operator_new__(__n);
  uVar21 = uVar16 + 1;
  local_128 = (ulong)uVar16;
  rows = (uchar *)operator_new__((ulong)(uVar22 * uVar21));
  local_158 = fopen((outputPath->_M_dataplus)._M_p,"wb");
  if (local_158 != (FILE *)0x0) {
    png_save_uint_32(buf_IHDR,this->_width);
    png_save_uint_32(buf_IHDR + 4,this->_height);
    buf_IHDR[8] = '\b';
    buf_IHDR[9] = (uchar)local_15c;
    buf_IHDR[10] = '\0';
    buf_IHDR[0xb] = '\0';
    buf_IHDR[0xc] = '\0';
    png_save_uint_32(buf_acTL,(int)((ulong)((long)(this->_frames).
                                                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->_frames).
                                                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              0x7a44c6b - first);
    png_save_uint_32(buf_acTL + 4,local_148 & 0xffffffff);
    fwrite(png_sign,1,8,local_158);
    write_chunk(this,(FILE *)local_158,"IHDR",buf_IHDR,0xd);
    uVar22 = 0;
    if (1 < (ulong)(((long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf4898d5f85bb395)) {
      write_chunk(this,(FILE *)local_158,"acTL",buf_acTL,8);
      uVar22 = first;
    }
    local_130 = CONCAT44(local_130._4_4_,uVar22);
    if (this->_palsize != 0) {
      write_chunk(this,(FILE *)local_158,"PLTE",&this->_palette[0].r,this->_palsize * 3);
    }
    if (this->_trnssize != 0) {
      write_chunk(this,(FILE *)local_158,"tRNS",this->_trns,this->_trnssize);
    }
    *(undefined8 *)((long)&(this->_op_zstream1).zfree + 4) = 0;
    *(undefined8 *)((long)&(this->_op_zstream1).opaque + 4) = 0;
    (this->_op_zstream1).zalloc = (alloc_func)0x0;
    (this->_op_zstream1).zfree = (free_func)0x0;
    deflateInit2_(&this->_op_zstream1,2,8,0xf,8,0,"1.2.11",0x70);
    (this->_op_zstream2).zalloc = (alloc_func)0x0;
    (this->_op_zstream2).zfree = (free_func)0x0;
    *(undefined8 *)((long)&(this->_op_zstream2).zfree + 4) = 0;
    *(undefined8 *)((long)&(this->_op_zstream2).opaque + 4) = 0;
    deflateInit2_(&this->_op_zstream2,2,8,0xf,8,1,"1.2.11",0x70);
    uVar22 = this->_height;
    idat_size = uVar22 * uVar21;
    uVar15 = (ulong)((idat_size + 0x3f >> 6) + (idat_size + 7 >> 3) + idat_size + 0xb);
    local_138 = (uchar *)operator_new__(uVar15);
    puVar6 = (uchar *)operator_new__(uVar15);
    this->_op_zbuf1 = puVar6;
    local_148 = uVar15;
    puVar6 = (uchar *)operator_new__(uVar15);
    this->_op_zbuf2 = puVar6;
    uVar15 = (ulong)uVar21;
    puVar6 = (uchar *)operator_new__(uVar15);
    this->_row_buf = puVar6;
    puVar7 = (uchar *)operator_new__(uVar15);
    this->_sub_row = puVar7;
    local_170 = (uchar *)operator_new__(uVar15);
    this->_up_row = local_170;
    puVar8 = (uchar *)operator_new__(uVar15);
    this->_avg_row = puVar8;
    puVar9 = (uchar *)operator_new__(uVar15);
    this->_paeth_row = puVar9;
    *puVar6 = '\0';
    *puVar7 = '\x01';
    *local_170 = '\x02';
    *puVar8 = '\x03';
    *puVar9 = '\x04';
    uVar16 = this->_width;
    this->_next_seq_num = 0;
    lVar10 = 0x44;
    do {
      *(undefined4 *)
       ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
               super__Vector_impl_data._M_start + lVar10) = 0;
      lVar10 = lVar10 + 0x28;
    } while (lVar10 != 0x134);
    iVar4 = (int)local_168;
    iVar5 = (int)local_128;
    iVar25 = (int)local_148;
    deflate_rect_op(this,((this->_frames).
                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_pixels,0,0,uVar16,uVar22,
                    iVar4,iVar5,iVar25,0);
    deflate_rect_fin(this,local_138,&zsize,iVar4,iVar5,rows,iVar25,0);
    if ((uint)local_130 != 0) {
      write_IDATs(this,(FILE *)local_158,0,local_138,zsize,idat_size);
      lVar10 = 0x44;
      do {
        *(undefined4 *)
         ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar10) = 0;
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0x134);
      iVar4 = (int)local_168;
      iVar5 = (int)local_128;
      iVar25 = (int)local_148;
      deflate_rect_op(this,(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._pixels,0,0,uVar16,uVar22,
                      iVar4,iVar5,iVar25,0);
      deflate_rect_fin(this,local_138,&zsize,iVar4,iVar5,rows,iVar25,0);
    }
    uVar18 = (ulong)(uint)local_130;
    pAVar11 = (this->_frames).
              super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar15 = ((long)(this->_frames).
                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pAVar11 >> 4) *
             -0xf4898d5f85bb395;
    if (uVar18 < uVar15 - 1) {
      uVar23 = 0;
      coltype_00 = (uchar)local_15c;
      local_184 = 0;
      local_170 = (uchar *)0x0;
      uVar19 = uVar18;
      do {
        lVar10 = 0x44;
        do {
          *(undefined4 *)
           ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar10) = 0;
          lVar10 = lVar10 + 0x28;
        } while (lVar10 != 0x134);
        local_130 = uVar19 * 0x430;
        uVar1 = uVar19 + 1;
        uVar21 = (uint)uVar14;
        get_rect(this,this->_width,this->_height,pAVar11[uVar19]._pixels,pAVar11[uVar19 + 1]._pixels
                 ,ptemp,coltype_00,(uint)local_168,(uint)local_128,(int)local_148,(uint)local_150,
                 uVar21,0);
        uVar20 = (uchar)(uVar14 >> 0x10);
        if ((char)local_140 == '\0') {
          pAVar11 = (this->_frames).
                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(pimage1,*(void **)((long)pAVar11->_palette + local_130 + -0x11),__n);
          if ((uchar)local_15c == '\x02') {
            if (uVar22 != 0) {
              uVar13 = this->_width;
              uVar12 = (local_184 * uVar13 + (int)local_170) * 3;
              uVar17 = 0;
              do {
                uVar15 = (ulong)uVar16;
                uVar2 = uVar12;
                if (uVar16 != 0) {
                  do {
                    pimage1[(ulong)uVar2 + 2] = uVar20;
                    *(short *)(pimage1 + uVar2) = (short)uVar14;
                    uVar15 = uVar15 - 1;
                    uVar2 = uVar2 + 3;
                  } while (uVar15 != 0);
                }
                uVar17 = uVar17 + 1;
                uVar12 = uVar12 + uVar13 * 3;
              } while (uVar17 != uVar22);
            }
          }
          else if (uVar22 != 0) {
            uVar13 = this->_width;
            iVar4 = (int)local_168;
            uVar15 = (ulong)uVar22;
            uVar12 = (local_184 * uVar13 + (int)local_170) * iVar4;
            do {
              memset(pimage1 + uVar12,uVar21 & 0xff,(ulong)(uVar16 * iVar4));
              uVar12 = uVar12 + uVar13 * iVar4;
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
          }
          get_rect(this,this->_width,this->_height,pimage1,pAVar11[uVar1]._pixels,ptemp_00,
                   coltype_00,(uint)local_168,(uint)local_128,(int)local_148,1,uVar21,1);
        }
        if (uVar18 < uVar19) {
          get_rect(this,this->_width,this->_height,local_120,
                   (this->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar1]._pixels,ptemp_01,coltype_00,
                   (uint)local_168,(uint)local_128,(int)local_148,(uint)local_150,uVar21,2);
        }
        uVar13 = this->_op[0].size;
        uVar15 = 0;
        lVar10 = 0x6c;
        uVar12 = 1;
        do {
          if ((*(int *)((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar10) != 0) &&
             (uVar17 = *(uint *)((long)this->_op + lVar10 + -0x3c), uVar17 < uVar13)) {
            uVar15 = (ulong)uVar12;
            uVar13 = uVar17;
          }
          lVar10 = lVar10 + 0x28;
          uVar12 = uVar12 + 1;
        } while (lVar10 != 0x134);
        iVar4 = (int)uVar15;
        this->_next_seq_num = this->_next_seq_num + 1;
        png_save_uint_32(buf_fcTL);
        png_save_uint_32(buf_fcTL + 4,uVar16);
        png_save_uint_32(buf_fcTL + 8,uVar22);
        png_save_uint_32(buf_fcTL + 0xc,local_170);
        png_save_uint_32(buf_fcTL + 0x10,local_184);
        lVar10 = local_130;
        png_save_uint_16(buf_fcTL + 0x14,
                         *(undefined4 *)
                          ((long)&((this->_frames).
                                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_delayNum + local_130
                          ));
        png_save_uint_16(buf_fcTL + 0x16,
                         *(undefined4 *)
                          ((long)&((this->_frames).
                                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_delayDen + lVar10));
        pFVar3 = local_158;
        buf_fcTL[0x19] = (uchar)uVar23;
        buf_fcTL[0x18] = (uchar)(uVar15 >> 1);
        write_chunk(this,(FILE *)local_158,"fcTL",buf_fcTL,0x1a);
        write_IDATs(this,(FILE *)pFVar3,(int)uVar19,local_138,zsize,idat_size);
        uVar13 = (uint)(uVar15 >> 1) & 0xff;
        if ((uVar13 != 2) &&
           (memcpy(local_120,
                   *(void **)((long)((this->_frames).
                                     super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_palette +
                             local_130 + -0x11),__n), uVar13 == 1)) {
          if ((uchar)local_15c == '\x02') {
            if (uVar22 != 0) {
              uVar21 = this->_width;
              uVar13 = ((int)local_170 + local_184 * uVar21) * 3;
              uVar12 = 0;
              do {
                uVar19 = (ulong)uVar16;
                uVar17 = uVar13;
                if (uVar16 != 0) {
                  do {
                    local_120[(ulong)uVar17 + 2] = uVar20;
                    *(short *)(local_120 + uVar17) = (short)uVar14;
                    uVar19 = uVar19 - 1;
                    uVar17 = uVar17 + 3;
                  } while (uVar19 != 0);
                }
                uVar12 = uVar12 + 1;
                uVar13 = uVar13 + uVar21 * 3;
              } while (uVar12 != uVar22);
            }
          }
          else if (uVar22 != 0) {
            uVar13 = this->_width;
            iVar5 = (int)local_168;
            uVar19 = (ulong)uVar22;
            uVar22 = ((int)local_170 + local_184 * uVar13) * iVar5;
            do {
              memset(local_120 + uVar22,uVar21 & 0xff,(ulong)(uVar16 * iVar5));
              uVar22 = uVar22 + uVar13 * iVar5;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
        }
        local_170 = (uchar *)(ulong)(uint)this->_op[iVar4].x;
        local_184 = this->_op[iVar4].y;
        uVar16 = this->_op[iVar4].w;
        uVar22 = this->_op[iVar4].h;
        uVar23 = uVar15 & 0xffffffffffffff01;
        uVar20 = (uchar)uVar23;
        deflate_rect_fin(this,local_138,&zsize,(int)local_168,(int)local_128,rows,(int)local_148,
                         iVar4);
        pAVar11 = (this->_frames).
                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar15 = ((long)(this->_frames).
                        super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pAVar11 >> 4) *
                 -0xf4898d5f85bb395;
        uVar19 = uVar1;
      } while (uVar1 < uVar15 - 1);
    }
    else {
      local_170 = (uchar *)0x0;
      local_184 = 0;
      uVar20 = '\0';
    }
    if (1 < uVar15) {
      this->_next_seq_num = this->_next_seq_num + 1;
      png_save_uint_32(buf_fcTL);
      png_save_uint_32(buf_fcTL + 4,uVar16);
      png_save_uint_32(buf_fcTL + 8,uVar22);
      png_save_uint_32(buf_fcTL + 0xc,local_170);
      png_save_uint_32(buf_fcTL + 0x10,local_184);
      png_save_uint_16(buf_fcTL + 0x14,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]._delayNum);
      png_save_uint_16(buf_fcTL + 0x16,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]._delayDen);
      buf_fcTL[0x18] = '\0';
      buf_fcTL[0x19] = uVar20;
      write_chunk(this,(FILE *)local_158,"fcTL",buf_fcTL,0x1a);
    }
    puVar6 = local_138;
    pFVar3 = local_158;
    write_IDATs(this,(FILE *)local_158,
                (int)((ulong)((long)(this->_frames).
                                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_frames).
                                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x7a44c6b + -1
                ,local_138,zsize,idat_size);
    write_chunk(this,(FILE *)pFVar3,"tEXt",png_Software,0x1b);
    write_chunk(this,(FILE *)pFVar3,"IEND",(uchar *)0x0,0);
    fclose(pFVar3);
    operator_delete__(puVar6);
    if (this->_op_zbuf1 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf1);
    }
    if (this->_op_zbuf2 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf2);
    }
    if (this->_row_buf != (uchar *)0x0) {
      operator_delete__(this->_row_buf);
    }
    if (this->_sub_row != (uchar *)0x0) {
      operator_delete__(this->_sub_row);
    }
    if (this->_up_row != (uchar *)0x0) {
      operator_delete__(this->_up_row);
    }
    if (this->_avg_row != (uchar *)0x0) {
      operator_delete__(this->_avg_row);
    }
    if (this->_paeth_row != (uchar *)0x0) {
      operator_delete__(this->_paeth_row);
    }
    deflateEnd(&this->_op_zstream1);
    deflateEnd(&this->_op_zstream2);
    operator_delete__(pimage1);
    operator_delete__(ptemp);
    operator_delete__(ptemp_00);
    operator_delete__(ptemp_01);
    operator_delete__(local_120);
    operator_delete__(rows);
  }
  return local_158 != (FILE *)0x0;
}

Assistant:

bool APNGAsm::save(const std::string &outputPath, unsigned char coltype, unsigned int first, unsigned int loops)
  {
    unsigned int    j, k;
    unsigned int    has_tcolor = 0;
    unsigned int    tcolor = 0;
    unsigned int    i, rowbytes, imagesize;
    unsigned int    idat_size, zbuf_size, zsize;
    unsigned char * zbuf;
    FILE*           f;
    unsigned char   png_sign[8] = {137,  80,  78,  71,  13,  10,  26,  10};
    unsigned char   png_Software[27] = { 83, 111, 102, 116, 119, 97, 114, 101, '\0',
                                         65,  80,  78,  71,  32, 65, 115, 115, 101,
                                        109,  98, 108, 101, 114, 32,  51,  46,  48};

    unsigned int bpp = 1;
    if (coltype == 2)
      bpp = 3;
    else
    if (coltype == 4)
      bpp = 2;
    else
    if (coltype == 6)
      bpp = 4;

    if (coltype == 0)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = _trns[1];
      }
    }
    else
    if (coltype == 2)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = (((_trns[5]<<8)+_trns[3])<<8)+_trns[1];
      }
    }
    else
    if (coltype == 3)
    {
      for (i=0; i<_trnssize; i++)
      if (_trns[i] == 0)
      {
        has_tcolor = 1;
        tcolor = i;
        break;
      }
    }
    else
    {
      has_tcolor = 1;
      tcolor = 0;
    }

    rowbytes  = _width * bpp;
    imagesize = rowbytes * _height;

    unsigned char * temp  = new unsigned char[imagesize];
    unsigned char * over1 = new unsigned char[imagesize];
    unsigned char * over2 = new unsigned char[imagesize];
    unsigned char * over3 = new unsigned char[imagesize];
    unsigned char * prev  = new unsigned char[imagesize];
    unsigned char * rows  = new unsigned char[(rowbytes + 1) * _height];

    if ((f = fopen(outputPath.c_str(), "wb")) != 0)
    {
      unsigned char buf_IHDR[13];
      unsigned char buf_acTL[8];
      unsigned char buf_fcTL[26];

      png_save_uint_32(buf_IHDR, _width);
      png_save_uint_32(buf_IHDR + 4, _height);
      buf_IHDR[8] = 8;
      buf_IHDR[9] = coltype;
      buf_IHDR[10] = 0;
      buf_IHDR[11] = 0;
      buf_IHDR[12] = 0;

      png_save_uint_32(buf_acTL, _frames.size() - first);
      png_save_uint_32(buf_acTL + 4, loops);

      fwrite(png_sign, 1, 8, f);

      write_chunk(f, "IHDR", buf_IHDR, 13);

      if (_frames.size() > 1)
        write_chunk(f, "acTL", buf_acTL, 8);
      else
        first = 0;

      if (_palsize > 0)
        write_chunk(f, "PLTE", (unsigned char *)(&_palette), _palsize*3);

      if (_trnssize > 0)
        write_chunk(f, "tRNS", _trns, _trnssize);

      _op_zstream1.data_type = Z_BINARY;
      _op_zstream1.zalloc = Z_NULL;
      _op_zstream1.zfree = Z_NULL;
      _op_zstream1.opaque = Z_NULL;
      deflateInit2(&_op_zstream1, Z_BEST_SPEED+1, 8, 15, 8, Z_DEFAULT_STRATEGY);

      _op_zstream2.data_type = Z_BINARY;
      _op_zstream2.zalloc = Z_NULL;
      _op_zstream2.zfree = Z_NULL;
      _op_zstream2.opaque = Z_NULL;
      deflateInit2(&_op_zstream2, Z_BEST_SPEED+1, 8, 15, 8, Z_FILTERED);

      idat_size = (rowbytes + 1) * _height;
      zbuf_size = idat_size + ((idat_size + 7) >> 3) + ((idat_size + 63) >> 6) + 11;

      zbuf = new unsigned char[zbuf_size];
      _op_zbuf1 = new unsigned char[zbuf_size];
      _op_zbuf2 = new unsigned char[zbuf_size];
      _row_buf = new unsigned char[rowbytes + 1];
      _sub_row = new unsigned char[rowbytes + 1];
      _up_row = new unsigned char[rowbytes + 1];
      _avg_row = new unsigned char[rowbytes + 1];
      _paeth_row = new unsigned char[rowbytes + 1];

      _row_buf[0] = 0;
      _sub_row[0] = 1;
      _up_row[0] = 2;
      _avg_row[0] = 3;
      _paeth_row[0] = 4;

      unsigned int x0 = 0;
      unsigned int y0 = 0;
      unsigned int w0 = _width;
      unsigned int h0 = _height;
      unsigned char bop = 0;
      unsigned char dop = 0;
      _next_seq_num = 0;

      for (j=0; j<6; j++)
        _op[j].valid = 0;
      deflate_rect_op(_frames[0]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
      deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);

      if (first)
      {
        write_IDATs(f, 0, zbuf, zsize, idat_size);

        for (j=0; j<6; j++)
          _op[j].valid = 0;
        deflate_rect_op(_frames[1]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);
      }

      for (size_t n = first; n < _frames.size()-1; ++n)
      {
        unsigned int op_min;
        int          op_best;

        for (j=0; j<6; j++)
          _op[j].valid = 0;

        /* dispose = none */
        get_rect(_width, _height, _frames[n]._pixels, _frames[n+1]._pixels, over1, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 0);

        /* dispose = background */
        if (has_tcolor)
        {
          memcpy(temp, _frames[n]._pixels, imagesize);
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(temp + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(temp + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);

          get_rect(_width, _height, temp, _frames[n+1]._pixels, over2, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 1);
        }

        /* dispose = previous */
        if (n > first)
          get_rect(_width, _height, prev, _frames[n+1]._pixels, over3, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 2);

        op_min = _op[0].size;
        op_best = 0;
        for (j=1; j<6; j++)
        if (_op[j].valid)
        {
          if (_op[j].size < op_min)
          {
            op_min = _op[j].size;
            op_best = j;
          }
        }

        dop = op_best >> 1;

        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[n]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[n]._delayDen);
        buf_fcTL[24] = dop;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);

        write_IDATs(f, n, zbuf, zsize, idat_size);

        /* process apng dispose - begin */
        if (dop != 2)
          memcpy(prev, _frames[n]._pixels, imagesize);

        if (dop == 1)
        {
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(prev + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(prev + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);
        }
        /* process apng dispose - end */

        x0 = _op[op_best].x;
        y0 = _op[op_best].y;
        w0 = _op[op_best].w;
        h0 = _op[op_best].h;
        bop = op_best & 1;

        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, op_best);
      }

      if (_frames.size() > 1)
      {
        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[_frames.size()-1]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[_frames.size()-1]._delayDen);
        buf_fcTL[24] = 0;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);
      }

      write_IDATs(f, _frames.size()-1, zbuf, zsize, idat_size);

      write_chunk(f, "tEXt", png_Software, 27);
      write_chunk(f, "IEND", 0, 0);
      fclose(f);

      delete[] zbuf;
      delete[] _op_zbuf1;
      delete[] _op_zbuf2;
      delete[] _row_buf;
      delete[] _sub_row;
      delete[] _up_row;
      delete[] _avg_row;
      delete[] _paeth_row;

      deflateEnd(&_op_zstream1);
      deflateEnd(&_op_zstream2);
    }
    else
      return false;

    delete[] temp;
    delete[] over1;
    delete[] over2;
    delete[] over3;
    delete[] prev;
    delete[] rows;

    return true;
  }